

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int int_id;
  char *item_text;
  ImGuiListClipper clipper;
  char *local_58;
  ImVec2 local_50;
  ImGuiListClipper local_48;
  
  bVar2 = ListBoxHeader(label,items_count,height_in_items);
  if (bVar2) {
    ImGuiListClipper::Begin(&local_48,items_count,GImGui->FontSize + (GImGui->Style).ItemSpacing.y);
    bVar2 = false;
    while (bVar3 = ImGuiListClipper::Step(&local_48), int_id = local_48.DisplayStart, bVar3) {
      for (; int_id < local_48.DisplayEnd; int_id = int_id + 1) {
        iVar1 = *current_item;
        bVar3 = (*items_getter)(data,int_id,&local_58);
        if (!bVar3) {
          local_58 = "*Unknown item*";
        }
        PushID(int_id);
        local_50.x = 0.0;
        local_50.y = 0.0;
        bVar3 = Selectable(local_58,int_id == iVar1,0,&local_50);
        if (bVar3) {
          *current_item = int_id;
          bVar2 = true;
        }
        PopID();
      }
    }
    ListBoxFooter();
    ImGuiListClipper::~ImGuiListClipper(&local_48);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    if (!ListBoxHeader(label, items_count, height_in_items))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different or variable sizes you can create a custom version of ListBox() in your code without using the clipper.
    bool value_changed = false;
    ImGuiListClipper clipper(items_count, GetTextLineHeightWithSpacing());
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const bool item_selected = (i == *current_item);
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            PopID();
        }
    ListBoxFooter();
    return value_changed;
}